

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

DataStream * __thiscall DataStream::operator<<(DataStream *this,DBHeightKey *obj)

{
  uint uVar1;
  long in_FS_OFFSET;
  undefined1 local_1d;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1d = 0x74;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)this,
             (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish,&local_1d);
  uVar1 = obj->height;
  local_1c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)this,
             (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish,&local_1c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

DataStream& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return (*this);
    }